

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O3

void add_light(chunk_conflict *c,player *p,loc_conflict sgrid,wchar_t radius,wchar_t inten)

{
  int *piVar1;
  uint uVar2;
  wchar_t wVar3;
  wchar_t y;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  loc_conflict grid2;
  loc grid;
  wchar_t wVar8;
  wchar_t wVar9;
  wchar_t x;
  wchar_t x_00;
  int iVar10;
  bool bVar11;
  int local_38;
  
  if (L'\xffffffff' < radius) {
    wVar8 = -radius;
    iVar5 = radius * 2 + 1;
    iVar10 = iVar5;
    x_00 = wVar8;
    y = wVar8;
    do {
      grid2 = loc(x_00,y);
      grid = (loc)loc_sum(sgrid,grid2);
      local_38 = sgrid.y;
      uVar6 = grid.y - local_38;
      uVar2 = -uVar6;
      if (0 < (int)uVar6) {
        uVar2 = uVar6;
      }
      uVar7 = grid.x - sgrid.x;
      uVar6 = -uVar7;
      if (0 < (int)uVar7) {
        uVar6 = uVar7;
      }
      wVar3 = (uVar2 >> 1) + uVar6;
      if (uVar6 < uVar2) {
        wVar3 = (uVar6 >> 1) + uVar2;
      }
      _Var4 = square_in_bounds(c,grid);
      if ((((_Var4) && (wVar3 <= radius)) && (_Var4 = los(c,sgrid,(loc_conflict)grid), _Var4)) &&
         ((_Var4 = square_allowslos(c,grid), _Var4 ||
          (_Var4 = source_can_light_wall(c,p,sgrid,(loc_conflict)grid), _Var4)))) {
        wVar9 = -wVar3;
        if (inten < L'\x01') {
          wVar9 = wVar3;
        }
        piVar1 = &c->squares[(long)grid >> 0x20][grid.x].light;
        *piVar1 = *piVar1 + wVar9 + inten;
      }
      iVar10 = iVar10 + -1;
      x_00 = x_00 + L'\x01';
    } while ((iVar10 != 0) ||
            (bVar11 = y != radius, iVar10 = iVar5, x_00 = wVar8, y = y + L'\x01', bVar11));
  }
  return;
}

Assistant:

static void add_light(struct chunk *c, struct player *p, struct loc sgrid,
		int radius, int inten)
{
	int y;

	for (y = -radius; y <= radius; y++) {
		int x;

		for (x = -radius; x <= radius; x++) {
			struct loc grid = loc_sum(sgrid, loc(x, y));
			int dist = distance(sgrid, grid);
			if (!square_in_bounds(c, grid)) continue;
			if (dist > radius) continue;
			/* Don't propagate the light through walls. */
			if (!los(c, sgrid, grid)) continue;
			/*
			 * Only light a wall if the face lit is possibly visible
			 * to the player.
			 */
			if (!square_allowslos(c, grid) && !source_can_light_wall(c,
					p, sgrid, grid)) continue;
			/* Adjust the light level */
			if (inten > 0) {
				/* Light getting less further away */
				c->squares[grid.y][grid.x].light +=
					inten - dist;
			} else {
				/* Light getting greater further away */
				c->squares[grid.y][grid.x].light +=
					inten + dist;
			}
		}
	}
}